

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4280d61::DumpVisitor::onStartDIE(DumpVisitor *this,Unit *CU,Entry *DIE)

{
  raw_ostream *this_00;
  char *__n;
  bool bVar1;
  uint uVar2;
  Entry *extraout_RDX;
  ulong uVar3;
  
  this_00 = this->OS;
  uVar3 = (ulong)(DIE->AbbrCode).value;
  do {
    uVar2 = (uint)(byte)((byte)uVar3 | 0x80);
    if (uVar3 < 0x80) {
      uVar2 = (uint)uVar3;
    }
    __n = this_00->OutBufCur;
    if (__n < this_00->OutBufEnd) {
      DIE = (Entry *)(__n + 1);
      this_00->OutBufCur = (char *)DIE;
      *__n = (char)uVar2;
    }
    else {
      llvm::raw_ostream::write(this_00,uVar2 & 0xff,DIE,(size_t)__n);
      DIE = extraout_RDX;
    }
    bVar1 = 0x7f < uVar3;
    uVar3 = uVar3 >> 7;
  } while (bVar1);
  return;
}

Assistant:

void onStartDIE(const DWARFYAML::Unit &CU,
                  const DWARFYAML::Entry &DIE) override {
    encodeULEB128(DIE.AbbrCode, OS);
  }